

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleString_copyInBufferWithBiggerBufferThanNeeded_Test::testBody
          (TEST_SimpleString_copyInBufferWithBiggerBufferThanNeeded_Test *this)

{
  char *bufferToCopy;
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  char *buffer;
  size_t bufferSize;
  SimpleString str;
  TEST_SimpleString_copyInBufferWithBiggerBufferThanNeeded_Test *this_local;
  
  str.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)&bufferSize,"Hello");
  bufferToCopy = (char *)(*PlatformSpecificMalloc)(0x14);
  SimpleString::copyToBuffer((SimpleString *)&bufferSize,bufferToCopy,0x14);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString((SimpleString *)&bufferSize);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,pcVar2,bufferToCopy,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x233,pTVar3);
  (*PlatformSpecificFree)(bufferToCopy);
  SimpleString::~SimpleString((SimpleString *)&bufferSize);
  return;
}

Assistant:

TEST(SimpleString, copyInBufferWithBiggerBufferThanNeeded)
{
    SimpleString str("Hello");
    size_t bufferSize = 20;
    char* buffer= (char*) PlatformSpecificMalloc(bufferSize);
    str.copyToBuffer(buffer, bufferSize);
    STRCMP_EQUAL(str.asCharString(), buffer);
    PlatformSpecificFree(buffer);
}